

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

double chooseK(int n,int k)

{
  double t;
  int i;
  double c;
  int k_local;
  int n_local;
  
  k_local = k;
  if (n - k < k) {
    k_local = n - k;
  }
  c = 1.0;
  for (i = 0; i < k_local; i = i + 1) {
    c = ((double)(n - i) / (double)(i + 1)) * c;
  }
  return c;
}

Assistant:

double chooseK ( int n, int k )
{
  if(k > (n - k)) k = n - k;

  double c = 1;

  for(int i = 0; i < k; i++)
  {
    double t = double(n-i) / double(i+1);

    c *= t;
  }

    return c;
}